

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O0

TA_RetCode TA_GetLookback(TA_ParamHolder *param,TA_Integer *lookback)

{
  int *piVar1;
  long lVar2;
  code *pcVar3;
  undefined4 uVar4;
  undefined4 *in_RSI;
  undefined8 *in_RDI;
  TA_FrameLookback lookbackFunction;
  TA_FuncInfo *funcInfo;
  TA_FuncDef *funcDef;
  TA_ParamHolderPriv *paramHolderPriv;
  TA_RetCode local_4;
  
  if ((in_RDI == (undefined8 *)0x0) || (in_RSI == (undefined4 *)0x0)) {
    local_4 = TA_BAD_PARAM;
  }
  else {
    piVar1 = (int *)*in_RDI;
    if (*piVar1 == -0x5dfd4dfe) {
      if (*(long *)(piVar1 + 10) == 0) {
        local_4 = TA_INVALID_HANDLE;
      }
      else {
        lVar2 = *(long *)(*(long *)(piVar1 + 10) + 0x30);
        if (lVar2 == 0) {
          local_4 = TA_INTERNAL_ERROR|TA_BAD_PARAM;
        }
        else {
          pcVar3 = *(code **)(lVar2 + 0x30);
          if (pcVar3 == (code *)0x0) {
            local_4 = TA_INTERNAL_ERROR|TA_BAD_PARAM;
          }
          else {
            uVar4 = (*pcVar3)(piVar1);
            *in_RSI = uVar4;
            local_4 = TA_SUCCESS;
          }
        }
      }
    }
    else {
      local_4 = TA_INVALID_PARAM_HOLDER;
    }
  }
  return local_4;
}

Assistant:

TA_RetCode TA_GetLookback( const TA_ParamHolder *param, TA_Integer *lookback )
{
   const TA_ParamHolderPriv *paramHolderPriv;

   const TA_FuncDef *funcDef;
   const TA_FuncInfo *funcInfo;
   TA_FrameLookback lookbackFunction;

   if( (param == NULL) || (lookback == NULL))
   {
      return TA_BAD_PARAM;
   }

   paramHolderPriv = (TA_ParamHolderPriv *)(param->hiddenData);
   if( paramHolderPriv->magicNumber != TA_PARAM_HOLDER_PRIV_MAGIC_NB )
   {
      return TA_INVALID_PARAM_HOLDER;
   }

   /* Get the pointer on the lookback function. */
   funcInfo = paramHolderPriv->funcInfo;
   if( !funcInfo ) return TA_INVALID_HANDLE;

   funcDef = (const TA_FuncDef *)funcInfo->handle;
   if( !funcDef ) return TA_INTERNAL_ERROR(2);
   lookbackFunction = funcDef->lookback;
   if( !lookbackFunction ) return TA_INTERNAL_ERROR(2);

   /* Perform the function call. */
   *lookback = (*lookbackFunction)( paramHolderPriv );

   return TA_SUCCESS;
}